

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureImageIterator::TextureImageIterator
          (TextureImageIterator *this,ImageInfo *info,int levelCount)

{
  anon_unknown_0 local_2c [8];
  int local_24;
  
  if (info->m_target == 0x8513) {
    local_24 = 6;
  }
  else {
    getLevelSize(local_2c,info->m_target,&info->m_size,0);
  }
  this->m_levelImageCount = local_24;
  ImageInfo::ImageInfo(&this->m_info,info);
  this->m_currentLevel = 0;
  getLevelSize((anon_unknown_0 *)&this->m_levelSize,info->m_target,&info->m_size,0);
  this->m_currentImage = -1;
  this->m_levelCount = levelCount;
  return;
}

Assistant:

TextureImageIterator::TextureImageIterator (const ImageInfo info, int levelCount)
	: m_levelImageCount	(info.getTarget() == GL_TEXTURE_CUBE_MAP ? 6 : getLevelSize(info.getTarget(), info.getSize(), 0).z())
	, m_info			(info)
	, m_currentLevel	(0)
	, m_levelSize		(getLevelSize(info.getTarget(), info.getSize(), 0))
	, m_currentImage	(-1)
	, m_levelCount		(levelCount)
{
	DE_ASSERT(m_levelCount <= getLevelCount(info));
}